

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdFreeSplitTxOutHandle(void *handle,void *split_output_handle)

{
  void *pvVar1;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *this;
  long in_RSI;
  string *in_stack_00000028;
  void *in_stack_00000030;
  CfdException *except;
  exception *std_except;
  CfdCapiSplitTxOutData *data;
  int result;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  allocator local_51;
  string local_50 [52];
  undefined4 local_1c;
  long local_18;
  
  local_1c = 0xffffffff;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_18 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"SplitTxOut",&local_51);
    cfd::capi::CheckBuffer(in_stack_00000030,in_stack_00000028);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (*(long *)(local_18 + 0x18) != 0) {
      pvVar1 = *(void **)(local_18 + 0x18);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~vector
                  (in_stack_ffffffffffffff30);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(local_18 + 0x18) = 0;
    }
    if (*(long *)(local_18 + 0x20) != 0) {
      this = *(vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> **)(local_18 + 0x20);
      if (this != (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)0x0) {
        std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(this);
        operator_delete(this);
      }
      *(undefined8 *)(local_18 + 0x20) = 0;
    }
    if (*(long *)(local_18 + 0x28) != 0) {
      pvVar1 = *(void **)(local_18 + 0x28);
      if (pvVar1 != (void *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff30);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(local_18 + 0x28) = 0;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff80,"SplitTxOut",(allocator *)&stack0xffffffffffffff7f);
  cfd::capi::FreeBuffer
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  return 0;
}

Assistant:

int CfdFreeSplitTxOutHandle(void* handle, void* split_output_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (split_output_handle != nullptr) {
      CheckBuffer(split_output_handle, kPrefixSplitTxOut);
      CfdCapiSplitTxOutData* data =
          static_cast<CfdCapiSplitTxOutData*>(split_output_handle);
      if (data->amount_list != nullptr) {
        delete data->amount_list;
        data->amount_list = nullptr;
      }
      if (data->locking_script_list != nullptr) {
        delete data->locking_script_list;
        data->locking_script_list = nullptr;
      }
      if (data->nonce_list != nullptr) {
        delete data->nonce_list;
        data->nonce_list = nullptr;
      }
    }
    FreeBuffer(
        split_output_handle, kPrefixSplitTxOut, sizeof(CfdCapiSplitTxOutData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}